

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_vector.cc
# Opt level: O1

void __thiscall ipx::IndexedVector::set_to_zero(IndexedVector *this)

{
  int iVar1;
  size_t sVar2;
  double *pdVar3;
  pointer piVar4;
  long lVar5;
  
  iVar1 = this->nnz_;
  if (((long)iVar1 < 0) || ((double)(int)(this->elements_)._M_size * 0.1 < (double)iVar1)) {
    sVar2 = (this->elements_)._M_size;
    if (sVar2 != 0) {
      memset((this->elements_)._M_data,0,sVar2 << 3);
    }
  }
  else if (iVar1 != 0) {
    pdVar3 = (this->elements_)._M_data;
    piVar4 = (this->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar3[piVar4[lVar5]] = 0.0;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  this->nnz_ = 0;
  return;
}

Assistant:

void IndexedVector::set_to_zero() {
    if (sparse()) {
        for (Int p = 0; p < nnz_; p++)
            elements_[pattern_[p]] = 0.0;
    } else {
        elements_ = 0.0;
    }
    nnz_ = 0;
}